

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void lws_context_deprecate(lws_context *context,lws_reload_func cb)

{
  unsigned_short *puVar1;
  lws_vhost *plVar2;
  lws *wsi;
  lws_vhost *plVar3;
  
  for (plVar2 = context->vhost_list; plVar2 != (lws_vhost *)0x0; plVar2 = plVar2->vhost_next) {
    wsi = plVar2->lserv_wsi;
    if (wsi != (lws *)0x0) {
      wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
      lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"ctx deprecate");
      puVar1 = &wsi->context->deprecation_pending_listen_close_count;
      *puVar1 = *puVar1 + 1;
      for (plVar3 = context->vhost_list; plVar3 != (lws_vhost *)0x0; plVar3 = plVar3->vhost_next) {
        if (plVar3->lserv_wsi == wsi) {
          plVar3->lserv_wsi = (lws *)0x0;
        }
      }
    }
  }
  context->field_0x510 = context->field_0x510 | 1;
  context->deprecation_cb = cb;
  return;
}

Assistant:

void
lws_context_deprecate(struct lws_context *context, lws_reload_func cb)
{
	struct lws_vhost *vh = context->vhost_list, *vh1;

	/*
	 * "deprecation" means disable the context from accepting any new
	 * connections and free up listen sockets to be used by a replacement
	 * context.
	 *
	 * Otherwise the deprecated context remains operational, until its
	 * number of connected sockets falls to zero, when it is deleted.
	 */

	/* for each vhost, close his listen socket */

	while (vh) {
		struct lws *wsi = vh->lserv_wsi;

		if (wsi) {
			wsi->socket_is_permanently_unusable = 1;
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "ctx deprecate");
			wsi->context->deprecation_pending_listen_close_count++;
			/*
			 * other vhosts can share the listen port, they
			 * point to the same wsi.  So zap those too.
			 */
			vh1 = context->vhost_list;
			while (vh1) {
				if (vh1->lserv_wsi == wsi)
					vh1->lserv_wsi = NULL;
				vh1 = vh1->vhost_next;
			}
		}
		vh = vh->vhost_next;
	}

	context->deprecated = 1;
	context->deprecation_cb = cb;
}